

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

char * __thiscall QMetaEnum::valueToKey(QMetaEnum *this,quint64 value)

{
  uint uVar1;
  uint uVar2;
  QMetaObject *pQVar3;
  uint *puVar4;
  uint *puVar5;
  QMetaTypeInterface *pQVar6;
  quint64 qVar7;
  EnumExtendMode mode;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  pQVar3 = this->mobj;
  if (pQVar3 == (QMetaObject *)0x0) {
    return (char *)0x0;
  }
  puVar4 = (this->data).d;
  uVar11 = puVar4[2];
  iVar8 = 0x40;
  if (((uVar11 & 0x40) == 0) && (iVar8 = 0, (uVar11 & 1) == 0)) {
    puVar5 = (pQVar3->d).data;
    pQVar6 = (pQVar3->d).metaTypes
             [(long)(int)puVar5[6] +
              (ulong)((int)((ulong)((long)puVar4 - (long)puVar5) >> 2) - puVar5[9]) / 5];
    if (pQVar6 == (QMetaTypeInterface *)0x0) {
      iVar8 = -1;
    }
    else {
      iVar8 = ((pQVar6->flags >> 8 & 1) != 0) - 1;
    }
  }
  qVar7 = value;
  if (iVar8 != 0) {
    if (iVar8 == 0x40) goto LAB_002871bd;
    qVar7 = value + 0x80000000;
  }
  if (qVar7 >> 0x20 != 0) {
    return (char *)0x0;
  }
LAB_002871bd:
  puVar4 = (this->data).d;
  uVar1 = puVar4[3];
  lVar9 = (long)(int)uVar1;
  if (lVar9 < 1) {
    return (char *)0x0;
  }
  puVar5 = (pQVar3->d).data;
  uVar10 = puVar4[4];
  uVar11 = uVar10 + uVar1 * 2;
  while( true ) {
    uVar2 = puVar5[uVar10 + 1];
    if (iVar8 < 1) {
      qVar7 = (long)(int)uVar2;
      if (iVar8 == 0) {
        qVar7 = (ulong)uVar2;
      }
    }
    else {
      qVar7 = CONCAT44(puVar5[uVar11],uVar2);
    }
    if (qVar7 == value) break;
    uVar10 = uVar10 + 2;
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + -1;
    if (lVar9 == 0) {
      return (char *)0x0;
    }
  }
  puVar4 = (pQVar3->d).stringdata;
  return (char *)((ulong)puVar4[(long)(int)puVar5[uVar10] * 2] + (long)puVar4);
}

Assistant:

const char *QMetaEnum::valueToKey(quint64 value) const
{
    if (!mobj)
        return nullptr;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return nullptr;

    for (int i = 0; i < int(data.keyCount()); ++i) {
        if (value == value_helper(i, mode))
            return rawStringData(mobj, mobj->d.data[data.data() + 2 * i]);
    }
    return nullptr;
}